

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImVector<ImGuiPopupData> *this;
  ImGuiWindow *under_this_window;
  ImGuiContext *pIVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *window;
  
  pIVar1 = GImGui;
  if ((remaining < 0) || ((GImGui->OpenPopupStack).Size <= remaining)) {
    __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x1d7f,"void ImGui::ClosePopupToLevel(int, bool)");
  }
  this = &GImGui->OpenPopupStack;
  pIVar2 = ImVector<ImGuiPopupData>::operator[](this,remaining);
  window = pIVar2->SourceWindow;
  pIVar2 = ImVector<ImGuiPopupData>::operator[](this,remaining);
  under_this_window = pIVar2->Window;
  ImVector<ImGuiPopupData>::resize(this,remaining);
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if (window == (ImGuiWindow *)0x0) {
    window = (ImGuiWindow *)0x0;
  }
  else {
    if ((window->WasActive == false) && (under_this_window != (ImGuiWindow *)0x0)) {
      FocusTopMostWindowUnderOne(under_this_window,(ImGuiWindow *)0x0);
      return;
    }
    if ((pIVar1->NavLayer == ImGuiNavLayer_Main) &&
       (window->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      window = window->NavLastChildNavWindow;
    }
  }
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == 0 && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}